

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe_file_system.cpp
# Opt level: O1

void __thiscall duckdb::PipeFile::~PipeFile(PipeFile *this)

{
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var1;
  pointer pcVar2;
  
  (this->super_FileHandle)._vptr_FileHandle = (_func_int **)&PTR__PipeFile_02480238;
  _Var1._M_head_impl =
       (this->child_handle).
       super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (FileHandle *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_FileHandle + 8))();
  }
  (this->child_handle).
  super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  (this->super_FileHandle)._vptr_FileHandle = (_func_int **)&PTR__FileHandle_024795d0;
  pcVar2 = (this->super_FileHandle).path._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_FileHandle).path.field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit PipeFile(unique_ptr<FileHandle> child_handle_p)
	    : FileHandle(pipe_fs, child_handle_p->path, child_handle_p->GetFlags()),
	      child_handle(std::move(child_handle_p)) {
	}